

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O0

bool __thiscall QSqlCachedResult::isNull(QSqlCachedResult *this,int i)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  QSqlCachedResultPrivate *pQVar4;
  int in_ESI;
  QSqlResult *in_RDI;
  int idx;
  QSqlCachedResultPrivate *d;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  bool local_1;
  
  pQVar4 = d_func((QSqlCachedResult *)0x119b20);
  iVar2 = in_ESI;
  if (((byte)pQVar4[0xaa] & 1) == 0) {
    iVar2 = QSqlResult::at(in_RDI);
    iVar2 = iVar2 * *(int *)(pQVar4 + 0xcc) + in_ESI;
  }
  if ((((in_ESI < *(int *)(pQVar4 + 0xcc)) && (-1 < in_ESI)) &&
      (iVar5 = iVar2, iVar3 = QSqlResult::at(in_RDI), -1 < iVar3)) &&
     (iVar2 < *(int *)(pQVar4 + 200))) {
    QList<QVariant>::at((QList<QVariant> *)in_RDI,CONCAT44(iVar5,in_stack_ffffffffffffffc8));
    bVar1 = QVariant::isNull();
    local_1 = (bool)(bVar1 & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QSqlCachedResult::isNull(int i)
{
    Q_D(const QSqlCachedResult);
    int idx = d->forwardOnly ? i : at() * d->colCount + i;
    if (i >= d->colCount || i < 0 || at() < 0 || idx >= d->rowCacheEnd)
        return true;

    return d->cache.at(idx).isNull();
}